

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::setPlatformMenu(QMenuPrivate *this,QPlatformMenu *menu)

{
  char *pcVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  Connection CStack_38;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QWidgetPrivate).field_0x8;
  pDVar3 = (this->platformMenu).wp.d;
  if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
      ((this->platformMenu).wp.value != (QObject *)0x0)) &&
     (*(long *)(*(long *)((this->platformMenu).wp.value + 8) + 0x10) == 0)) {
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->platformMenu).wp.value;
    }
    if (pQVar4 != (QObject *)0x0) {
      (**(code **)(*(long *)pQVar4 + 0x20))();
    }
  }
  if (menu == (QPlatformMenu *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menu);
  }
  pDVar2 = (this->platformMenu).wp.d;
  (this->platformMenu).wp.d = pDVar3;
  (this->platformMenu).wp.value = (QObject *)menu;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
  pDVar3 = (this->platformMenu).wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     ((this->platformMenu).wp.value != (QObject *)0x0)) {
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->platformMenu).wp.value;
    }
    pQVar5 = (QObject *)0x0;
    QObject::connect(local_30,(char *)pQVar4,(QObject *)"2aboutToShow()",pcVar1,0x6ea746);
    QMetaObject::Connection::~Connection((Connection *)local_30);
    pDVar3 = (this->platformMenu).wp.d;
    if (pDVar3 != (Data *)0x0) {
      if (*(int *)(pDVar3 + 4) == 0) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = (this->platformMenu).wp.value;
      }
    }
    QObject::connect((QObject *)&CStack_38,(char *)pQVar5,(QObject *)"2aboutToHide()",pcVar1,
                     0x6ea764);
    QMetaObject::Connection::~Connection(&CStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::setPlatformMenu(QPlatformMenu *menu)
{
    Q_Q(QMenu);
    if (!platformMenu.isNull() && !platformMenu->parent())
        delete platformMenu.data();

    platformMenu = menu;
    if (!platformMenu.isNull()) {
        QObject::connect(platformMenu, SIGNAL(aboutToShow()), q, SLOT(_q_platformMenuAboutToShow()));
        QObject::connect(platformMenu, SIGNAL(aboutToHide()), q, SIGNAL(aboutToHide()));
    }
}